

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void libevent_log_cb(int severity,char *msg)

{
  bool bVar1;
  Level level;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char *msg_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  level = Error;
  if ((uint)severity < 3) {
    level = severity + Debug;
  }
  msg_local = msg;
  bVar1 = LogAcceptCategory(LIBEVENT,level);
  if (bVar1) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "libevent_log_cb";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<char_const*>
              (logging_function,source_file,0x1b4,LIBEVENT,level,(ConstevalFormatString<1U>)0xe4f3f8
               ,&msg_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void libevent_log_cb(int severity, const char *msg)
{
    BCLog::Level level;
    switch (severity) {
    case EVENT_LOG_DEBUG:
        level = BCLog::Level::Debug;
        break;
    case EVENT_LOG_MSG:
        level = BCLog::Level::Info;
        break;
    case EVENT_LOG_WARN:
        level = BCLog::Level::Warning;
        break;
    default: // EVENT_LOG_ERR and others are mapped to error
        level = BCLog::Level::Error;
        break;
    }
    LogPrintLevel(BCLog::LIBEVENT, level, "%s\n", msg);
}